

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

AssertionResult __thiscall
(anonymous_namespace)::AnyWriteChecker::operator()(void *this,char *param_1,int *value)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  int iVar2;
  AssertionResult *pAVar3;
  undefined8 extraout_RAX;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> actual;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expected;
  AssertionResult result;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> writer;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> os;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a28;
  AssertionResult *local_a08;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a00;
  char *local_9e0;
  AssertionResult local_9d8;
  undefined1 *local_9c8 [2];
  undefined1 local_9b8 [16];
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> local_9a8;
  AssertionResult local_998 [7];
  ios_base local_928 [264];
  basic_buffer<wchar_t> local_820;
  wchar_t local_800 [500];
  
  local_9e0 = "char";
  local_820.size_ = 0;
  local_820._vptr_basic_buffer = (_func_int **)&PTR_grow_002a3c18;
  local_820.capacity_ = 500;
  local_9a8.locale_.locale_ = (void *)0x0;
  local_9a8.out_.container = &local_820;
  local_820.ptr_ = local_800;
  fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
  write_decimal<int>((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                      *)&local_9a8,*(int *)param_1);
  local_a28._M_dataplus._M_p = (pointer)&local_a28.field_2;
  local_a08 = (AssertionResult *)this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a28,local_820.ptr_,(long)local_820.ptr_ + local_820.size_);
  paVar1 = &local_a00.field_2;
  local_a00._M_string_length = 0;
  local_a00.field_2._M_local_buf[0] = local_a00.field_2._M_local_buf[0] & 0xffffff00;
  local_a00._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
  std::ostream::operator<<(local_998,*(int *)param_1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a00,(string *)local_9c8);
  if (local_9c8[0] != local_9b8) {
    operator_delete(local_9c8[0]);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
  std::ios_base::~ios_base(local_928);
  if (local_a00._M_string_length == local_a28._M_string_length) {
    if (local_a00._M_string_length != 0) {
      iVar2 = bcmp(local_a00._M_dataplus._M_p,local_a28._M_dataplus._M_p,local_a00._M_string_length)
      ;
      if (iVar2 != 0) goto LAB_001203bd;
    }
    testing::AssertionSuccess();
  }
  else {
LAB_001203bd:
    testing::AssertionFailure();
    pAVar3 = testing::AssertionResult::operator<<(local_998,(char (*) [19])"Value of: (Writer<");
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,&local_9e0);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [21])">() << value).str()\n");
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [11])0x24a059);
    pAVar3 = testing::AssertionResult::operator<<
                       (pAVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_a28);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [2])0x24a728);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [11])0x24a065);
    pAVar3 = testing::AssertionResult::operator<<
                       (pAVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_a00);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [2])0x24a728);
    testing::AssertionResult::AssertionResult(&local_9d8,pAVar3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_998[0].message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a00._M_dataplus._M_p != paVar1) {
    operator_delete(local_a00._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a28._M_dataplus._M_p != &local_a28.field_2) {
    operator_delete(local_a28._M_dataplus._M_p);
  }
  local_820._vptr_basic_buffer = (_func_int **)&PTR_grow_002a3c18;
  if (local_820.ptr_ != local_800) {
    operator_delete(local_820.ptr_);
  }
  if (local_9d8.success_ != true) {
    testing::AssertionResult::AssertionResult(local_a08,&local_9d8);
    goto LAB_001206e7;
  }
  local_9e0 = "wchar_t";
  local_820.size_ = 0;
  local_820._vptr_basic_buffer = (_func_int **)&PTR_grow_002a3d40;
  local_820.capacity_ = 500;
  local_9a8.locale_.locale_ = (void *)0x0;
  local_9a8.out_.container = &local_820;
  local_820.ptr_ = local_800;
  fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
  write_decimal<int>(&local_9a8,*(int *)param_1);
  local_a28._M_dataplus._M_p = (pointer)&local_a28.field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_a28,local_820.ptr_,local_820.ptr_ + local_820.size_);
  local_a00._M_string_length = 0;
  local_a00.field_2._M_local_buf[0] = L'\0';
  local_a00._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_998);
  std::wostream::operator<<((wostream *)local_998,*(int *)param_1);
  std::__cxx11::wstringbuf::str();
  std::__cxx11::wstring::operator=((wstring *)&local_a00,(wstring *)local_9c8);
  if (local_9c8[0] != local_9b8) {
    operator_delete(local_9c8[0]);
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_998);
  std::ios_base::~ios_base(local_928);
  if (local_a00._M_string_length == local_a28._M_string_length) {
    if (local_a00._M_string_length != 0) {
      iVar2 = wmemcmp(local_a00._M_dataplus._M_p,local_a28._M_dataplus._M_p,
                      local_a00._M_string_length);
      if (iVar2 != 0) goto LAB_001205e1;
    }
    testing::AssertionSuccess();
  }
  else {
LAB_001205e1:
    testing::AssertionFailure();
    pAVar3 = testing::AssertionResult::operator<<(local_998,(char (*) [19])"Value of: (Writer<");
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,&local_9e0);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [21])">() << value).str()\n");
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [11])0x24a059);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,&local_a28);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [2])0x24a728);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [11])0x24a065);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,&local_a00);
    pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [2])0x24a728);
    testing::AssertionResult::AssertionResult(local_a08,pAVar3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_998[0].message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a00._M_dataplus._M_p != paVar1) {
    operator_delete(local_a00._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a28._M_dataplus._M_p != &local_a28.field_2) {
    operator_delete(local_a28._M_dataplus._M_p);
  }
  local_820._vptr_basic_buffer = (_func_int **)&PTR_grow_002a3d40;
  if (local_820.ptr_ != local_800) {
    operator_delete(local_820.ptr_);
  }
LAB_001206e7:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_9d8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  AVar4.message_.ptr_ = extraout_RDX.ptr_;
  AVar4._0_8_ = extraout_RAX;
  return AVar4;
}

Assistant:

::testing::AssertionResult operator()(const char *, const T &value) const {
    ::testing::AssertionResult result = check_write<char>(value, "char");
    return result ? check_write<wchar_t>(value, "wchar_t") : result;
  }